

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_2d_view_of_3d_features
          (Impl *this,Value *state,VkPhysicalDeviceImage2DViewOf3DFeaturesEXT **out_features)

{
  uint uVar1;
  VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *pVVar2;
  Type pGVar3;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT>
                     (&this->allocator);
  *out_features = pVVar2;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"image2DViewOf3D");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->image2DViewOf3D = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"sampler2DViewOf3D");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->sampler2DViewOf3D = uVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_2d_view_of_3d_features(
		const Value &state,
		VkPhysicalDeviceImage2DViewOf3DFeaturesEXT **out_features)
{
	auto *features = allocator.allocate_cleared<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT>();
	*out_features = features;

	features->image2DViewOf3D = state["image2DViewOf3D"].GetUint();
	features->sampler2DViewOf3D = state["sampler2DViewOf3D"].GetUint();
	return true;
}